

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLLinOp.cpp
# Opt level: O0

Any __thiscall amrex::MLLinOp::AnyMakeCoarseMG(MLLinOp *this,int amrlev,int mglev,IntVect *ng)

{
  undefined4 uVar1;
  IntVect *pIVar2;
  MFInfo *info;
  int in_EDX;
  BoxArray *in_RSI;
  DistributionMapping *in_RDI;
  MultiFab *in_R8;
  IntVect ratio;
  BoxArray cba;
  BoxArray *in_stack_fffffffffffffd58;
  BoxArray *in_stack_fffffffffffffd60;
  BoxArray *this_00;
  IntVect *in_stack_fffffffffffffd68;
  BoxArray *in_stack_fffffffffffffd70;
  Any *this_01;
  undefined4 in_stack_fffffffffffffd80;
  int ncomp;
  _Head_base<0UL,_amrex::Any::innards_base_*,_false> dm;
  IntVect *in_stack_fffffffffffffda0;
  MultiFab *this_02;
  undefined8 in_stack_fffffffffffffda8;
  undefined8 factory;
  IntVect local_94 [9];
  MultiFab *local_20;
  int local_14;
  
  dm._M_head_impl = (innards_base *)in_RDI;
  local_20 = in_R8;
  local_14 = in_EDX;
  Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
  ::operator[]((Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                *)in_stack_fffffffffffffd60,(size_type)in_stack_fffffffffffffd58);
  ncomp = (int)((ulong)in_RDI >> 0x20);
  Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
            ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)in_stack_fffffffffffffd60,
             (size_type)in_stack_fffffffffffffd58);
  BoxArray::BoxArray(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
  if (local_14 < 1) {
    pIVar2 = Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                       ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                        in_stack_fffffffffffffd60,(size_type)in_stack_fffffffffffffd58);
    local_94[0].vect._0_8_ = *(undefined8 *)pIVar2->vect;
    local_94[0].vect[2] = pIVar2->vect[2];
  }
  else {
    IntVect::IntVect(local_94,2);
  }
  BoxArray::coarsen((BoxArray *)in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
  BoxArray::convert(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  Vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
  ::operator[]((Vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                *)in_stack_fffffffffffffd60,(size_type)in_stack_fffffffffffffd58);
  info = (MFInfo *)
         Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::operator[]
                   ((Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                     *)in_stack_fffffffffffffd60,(size_type)in_stack_fffffffffffffd58);
  uVar1 = (**(code **)(*(long *)&in_RSI->m_bat + 0x28))();
  factory = (FabFactory<amrex::FArrayBox> *)0x0;
  this_01 = (Any *)&stack0xfffffffffffffda8;
  MFInfo::MFInfo((MFInfo *)0x150c95a);
  this_02 = (MultiFab *)0x0;
  this_00 = (BoxArray *)&stack0xfffffffffffffda0;
  DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory
            ((DefaultFabFactory<amrex::FArrayBox> *)this_00);
  MultiFab::MultiFab(this_02,in_RSI,(DistributionMapping *)dm._M_head_impl,ncomp,
                     (IntVect *)CONCAT44(uVar1,in_stack_fffffffffffffd80),info,
                     (FabFactory<amrex::FArrayBox> *)factory);
  Any::Any<amrex::MultiFab>(this_01,local_20);
  MultiFab::~MultiFab((MultiFab *)0x150c9c8);
  DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
            ((DefaultFabFactory<amrex::FArrayBox> *)0x150c9d2);
  MFInfo::~MFInfo((MFInfo *)0x150c9dc);
  BoxArray::~BoxArray(this_00);
  return (unique_ptr<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>)
         (unique_ptr<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>)
         dm._M_head_impl;
}

Assistant:

Any
MLLinOp::AnyMakeCoarseMG (int amrlev, int mglev, IntVect const& ng) const
{
    BoxArray cba = m_grids[amrlev][mglev];
    IntVect ratio = (amrlev > 0) ? IntVect(2) : mg_coarsen_ratio_vec[mglev];
    cba.coarsen(ratio);
    cba.convert(m_ixtype);
    return Any(MultiFab(cba, m_dmap[amrlev][mglev], getNComp(), ng));
}